

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool jsonip::parser::
     or_<jsonip::grammar::true_p,jsonip::grammar::false_p,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  pointer *ppSVar1;
  pointer *pppVar2;
  iterator __position;
  semantic_state *this;
  pointer ppVar3;
  helper *phVar4;
  bool bVar5;
  bool bVar6;
  pointer pSVar7;
  undefined1 auVar8 [16];
  undefined1 auStack_38 [8];
  State cur_state;
  
  auVar8 = std::istream::tellg();
  cur_state._0_8_ = auVar8._8_8_;
  auStack_38 = auVar8._0_8_;
  cur_state._8_8_ = state->line_;
  __position._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State>>
                *)&state->stack_,__position,(State *)auStack_38);
    auVar8._8_8_ = cur_state._0_8_;
    auVar8._0_8_ = auStack_38;
  }
  else {
    (__position._M_current)->line_ = cur_state._8_8_;
    (__position._M_current)->pos_ = (PositionType)auVar8[0];
    *(long *)&(__position._M_current)->field_0x1 = auVar8._1_8_;
    *(int7 *)&(__position._M_current)->field_0x9 = auVar8._9_7_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  cur_state._0_8_ = auVar8._8_8_;
  auStack_38 = auVar8._0_8_;
  std::istream::tellg();
  bVar5 = seq_<jsonip::parser::char_<(char)116>,jsonip::parser::char_<(char)114>,jsonip::parser::char_<(char)117>,jsonip::parser::char_<(char)101>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                    (state);
  std::istream::tellg();
  if (!bVar5) {
    bVar6 = seq_<jsonip::parser::char_<(char)102>,jsonip::parser::char_<(char)97>,jsonip::parser::char_<(char)108>,jsonip::parser::char_<(char)115>,jsonip::parser::char_<(char)101>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    auVar8 = std::istream::tellg();
    if (!bVar6) {
      if (*(long *)&state->max_pos_ < auVar8._0_8_) {
        state->max_pos_ = (PositionType)auVar8[0];
        *(long *)&state->field_0x29 = auVar8._1_8_;
        *(int7 *)&state->field_0x31 = auVar8._9_7_;
      }
      pSVar7 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::istream::seekg(state->reader_->in_,*(undefined8 *)(pSVar7 + -1),
                          *(undefined8 *)&pSVar7[-1].field_0x8);
      pSVar7 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      state->line_ = pSVar7[-1].line_;
      bVar5 = false;
      goto LAB_00112493;
    }
  }
  this = state->ss_;
  semantic_state::pre(this);
  ppVar3 = (this->state).
           super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  phVar4 = ppVar3[-1].second;
  (**(code **)(*(long *)phVar4 + 0x20))(phVar4,ppVar3 + -1,bVar5);
  pppVar2 = &(this->state).
             super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pppVar2 = *pppVar2 + -1;
  auVar8 = std::istream::tellg();
  if (*(long *)&state->max_pos_ < auVar8._0_8_) {
    state->max_pos_ = (PositionType)auVar8[0];
    *(long *)&state->field_0x29 = auVar8._1_8_;
    *(int7 *)&state->field_0x31 = auVar8._9_7_;
  }
  pSVar7 = (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = true;
LAB_00112493:
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar7 + -1;
  return bVar5;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) || C1::match(state) ||
                       C2::match(state) || C3::match(state) ||
                       C4::match(state) || C5::match(state) ||
                       C6::match(state) || C7::match(state);

            var ? state.commit() : state.rollback();

            return var;
        }